

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLProgram.cpp
# Opt level: O3

void __thiscall Diligent::GLProgram::~GLProgram(GLProgram *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  GLuint GVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pcVar3;
  pointer ppSVar4;
  
  this_00 = (this->m_pResources).
            super___shared_ptr<const_Diligent::ShaderResourcesGL,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  pcVar3 = (this->m_InfoLog)._M_dataplus._M_p;
  paVar1 = &(this->m_InfoLog).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != paVar1) {
    operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
  }
  ppSVar4 = (this->m_AttachedShaders).
            super__Vector_base<const_Diligent::ShaderGLImpl_*,_std::allocator<const_Diligent::ShaderGLImpl_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (ppSVar4 != (pointer)0x0) {
    operator_delete(ppSVar4,(long)(this->m_AttachedShaders).
                                  super__Vector_base<const_Diligent::ShaderGLImpl_*,_std::allocator<const_Diligent::ShaderGLImpl_*>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)ppSVar4
                   );
  }
  GVar2 = (this->m_GLProg).m_uiHandle;
  if (GVar2 != 0) {
    (*__glewDeleteProgram)(GVar2);
    (this->m_GLProg).m_uiHandle = 0;
  }
  return;
}

Assistant:

GLProgram::~GLProgram()
{
}